

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

void __thiscall
duckdb::WindowQuantileState<duckdb::interval_t>::UpdateSkip
          (WindowQuantileState<duckdb::interval_t> *this,CursorType *data,SubFrames *frames,
          IncludedType *included)

{
  SubFrames *this_00;
  ulong uVar1;
  bool bVar2;
  reference pvVar3;
  const_reference pvVar4;
  SkipListType *this_01;
  interval_t *piVar5;
  FrameBounds *frame;
  pointer pFVar6;
  SkipListType *local_58;
  pointer local_50;
  SkipListUpdater updater;
  
  if ((this->s).
      super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
      .
      super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_*,_false>
      ._M_head_impl !=
      (HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
       *)0x0) {
    this_00 = &this->prevs;
    pvVar3 = vector<duckdb::FrameBounds,_true>::back(this_00);
    uVar1 = pvVar3->end;
    pvVar4 = vector<duckdb::FrameBounds,_true>::front(frames);
    if (pvVar4->start < uVar1) {
      pvVar4 = vector<duckdb::FrameBounds,_true>::back(frames);
      uVar1 = pvVar4->end;
      pvVar3 = vector<duckdb::FrameBounds,_true>::front(this_00);
      if (pvVar3->start < uVar1) {
        updater.skip = GetSkipList(this,false);
        updater.data = data;
        updater.included = included;
        AggregateExecutor::
        IntersectFrames<duckdb::WindowQuantileState<duckdb::interval_t>::SkipListUpdater>
                  (this_00,frames,&updater);
        return;
      }
    }
  }
  this_01 = GetSkipList(this,true);
  local_50 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (pFVar6 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                _M_impl.super__Vector_impl_data._M_start; pFVar6 != local_50; pFVar6 = pFVar6 + 1) {
    for (local_58 = (SkipListType *)pFVar6->start; local_58 < (SkipListType *)pFVar6->end;
        local_58 = (SkipListType *)((long)&local_58->_vptr_HeadNode + 1)) {
      bVar2 = QuantileIncluded<duckdb::interval_t>::operator()(included,(idx_t *)&local_58);
      if (bVar2) {
        piVar5 = QuantileCursor<duckdb::interval_t>::operator[](data,(idx_t)local_58);
        updater.skip = local_58;
        updater.data = *(CursorType **)piVar5;
        updater.included = (IncludedType *)piVar5->micros;
        duckdb_skiplistlib::skip_list::
        HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
        ::insert(this_01,(pair<unsigned_long,_duckdb::interval_t> *)&updater);
      }
    }
  }
  return;
}

Assistant:

void UpdateSkip(CursorType &data, const SubFrames &frames, IncludedType &included) {
		//	No overlap, or no data
		if (!s || prevs.back().end <= frames.front().start || frames.back().end <= prevs.front().start) {
			auto &skip = GetSkipList(true);
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					if (included(i)) {
						skip.insert(SkipType(i, data[i]));
					}
				}
			}
		} else {
			auto &skip = GetSkipList();
			SkipListUpdater updater(skip, data, included);
			AggregateExecutor::IntersectFrames(prevs, frames, updater);
		}
	}